

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float32_suite::fail_array8_float32_overflow(void)

{
  undefined4 local_50;
  array<float,_1UL> value;
  size_type local_48;
  value_type input [10];
  decoder decoder;
  
  input[0] = 0xad;
  input[1] = '\b';
  input[2] = '\0';
  input[3] = '\0';
  input[4] = 0x80;
  input[5] = '?';
  input[6] = '\0';
  input[7] = '\0';
  input[8] = 0x80;
  input[9] = '?';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>(&decoder,&input);
  value._M_elems[0] = (_Type)0.0;
  local_48 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float32>::decode
                       (&decoder,(return_type *)&value,1);
  local_50 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd42,"void compact_float32_suite::fail_array8_float32_overflow()",&local_48,&local_50
            );
  return;
}

Assistant:

void fail_array8_float32_overflow()
{
    const value_type input[] = { token::code::array8_float32, 0x08, 0x00, 0x00, 0x80, 0x3F, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    std::array<token::float32::type, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}